

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::subpass_description_is_supported
          (Impl *this,VkSubpassDescription *sub)

{
  bool bVar1;
  uint32_t j;
  ulong uVar2;
  long lVar3;
  
  bVar1 = subpass_description_flags_is_supported(this,sub->flags);
  if (bVar1) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < sub->colorAttachmentCount; uVar2 = uVar2 + 1) {
      bVar1 = attachment_reference_is_supported
                        (this,(VkAttachmentReference *)
                              ((long)&sub->pColorAttachments->attachment + lVar3));
      if (!bVar1) {
        return false;
      }
      if ((sub->pResolveAttachments != (VkAttachmentReference *)0x0) &&
         (bVar1 = attachment_reference_is_supported
                            (this,(VkAttachmentReference *)
                                  ((long)&sub->pResolveAttachments->attachment + lVar3)), !bVar1)) {
        return false;
      }
      lVar3 = lVar3 + 8;
    }
    uVar2 = 0xffffffffffffffff;
    lVar3 = 0;
    do {
      uVar2 = uVar2 + 1;
      if (sub->inputAttachmentCount <= uVar2) {
        if ((sub->pDepthStencilAttachment != (VkAttachmentReference *)0x0) &&
           (bVar1 = attachment_reference_is_supported(this,sub->pDepthStencilAttachment), !bVar1)) {
          return false;
        }
        return true;
      }
      bVar1 = attachment_reference_is_supported
                        (this,(VkAttachmentReference *)
                              ((long)&sub->pInputAttachments->attachment + lVar3));
      lVar3 = lVar3 + 8;
    } while (bVar1);
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::subpass_description_is_supported(const VkSubpassDescription &sub) const
{
	if (!subpass_description_flags_is_supported(sub.flags))
		return false;

	for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
	{
		if (!attachment_reference_is_supported(sub.pColorAttachments[j]))
			return false;
		if (sub.pResolveAttachments && !attachment_reference_is_supported(sub.pResolveAttachments[j]))
			return false;
	}

	for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
		if (!attachment_reference_is_supported(sub.pInputAttachments[j]))
			return false;

	if (sub.pDepthStencilAttachment && !attachment_reference_is_supported(*sub.pDepthStencilAttachment))
		return false;

	return true;
}